

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::DebugInfoManager::GetDbgSetImportId(DebugInfoManager *this)

{
  IRContext *pIVar1;
  FeatureManager *pFVar2;
  undefined4 local_14;
  uint32_t setId;
  DebugInfoManager *this_local;
  
  pIVar1 = context(this);
  pFVar2 = IRContext::get_feature_mgr(pIVar1);
  local_14 = FeatureManager::GetExtInstImportId_OpenCL100DebugInfo(pFVar2);
  if (local_14 == 0) {
    pIVar1 = context(this);
    pFVar2 = IRContext::get_feature_mgr(pIVar1);
    local_14 = FeatureManager::GetExtInstImportId_Shader100DebugInfo(pFVar2);
  }
  return local_14;
}

Assistant:

uint32_t DebugInfoManager::GetDbgSetImportId() {
  uint32_t setId =
      context()->get_feature_mgr()->GetExtInstImportId_OpenCL100DebugInfo();
  if (setId == 0) {
    setId =
        context()->get_feature_mgr()->GetExtInstImportId_Shader100DebugInfo();
  }
  return setId;
}